

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DS_STATUS ds_list_iter_next(DsListIter *iter,void **pdata)

{
  void **pdata_local;
  DsListIter *iter_local;
  
  if ((iter == (DsListIter *)0x0) || (iter->curr == (DsListEntry *)0x0)) {
    iter_local._4_4_ = DS_STATUS_NULL;
  }
  else {
    iter->curr = iter->curr->next;
    iter->index = iter->index + 1;
    if (pdata != (void **)0x0) {
      *pdata = iter->curr->data;
    }
    iter_local._4_4_ = DS_STATUS_OK;
  }
  return iter_local._4_4_;
}

Assistant:

DS_STATUS ds_list_iter_next(DsListIter *iter, void **pdata)
{
    if (NULL == iter || NULL == iter->curr)
        return DS_STATUS_NULL;
    iter->curr = iter->curr->next;
    iter->index++;
    if (NULL != pdata)
        *pdata = iter->curr->data;
    return DS_STATUS_OK;
}